

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Options local_4b4;
  string path;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> param;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  Mesh mesh;
  Mesh omesh;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)std::cout,"Please specify the file name");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator>>((istream *)&std::cin,(string *)&path);
  }
  else {
    std::__cxx11::string::assign((char *)&path);
  }
  getOriginalMesh(&mesh,&path);
  bijectiveParameterization(&param,&mesh,0.0001);
  getParameterizedMesh(&omesh,&mesh,&param);
  std::operator+(&local_478,&path,"_param.obj");
  local_4b4.flags_ = 0;
  OpenMesh::IO::write_mesh<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>>
            (&omesh,&local_478,&local_4b4,6);
  std::__cxx11::string::~string((string *)&local_478);
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)&omesh);
  std::_Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::
  ~_Vector_base(&param.
                 super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
               );
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)&mesh);
  std::__cxx11::string::~string((string *)&path);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string path;
    if (argc < 2) {
        std::cout << "Please specify the file name" << std::endl;
        std::cin >> path;
    }
    else path = argv[1];
    // Import the original mesh
    auto mesh = getOriginalMesh(path);
    // parameterize the mesh    
    auto param = bijectiveParameterization(mesh);
    // export the parameterization
    auto omesh = getParameterizedMesh(mesh, param);
    OpenMesh::IO::write_mesh(omesh, path + "_param.obj");
    return 0;
}